

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSR.cpp
# Opt level: O2

void __thiscall CSR::initializeWithMatirx1(CSR *this,Matrix *m)

{
  double dVar1;
  int *piVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  double *pdVar6;
  ostream *poVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  int j;
  long lVar11;
  ulong __n;
  int i;
  long lVar12;
  
  iVar3 = m->colNo;
  this->row = m->rowNo;
  this->col = iVar3;
  iVar3 = Matrix::getNonzero(m);
  this->nonzero = iVar3;
  lVar8 = (long)this->row;
  uVar10 = lVar8 * 4 + 4;
  if (lVar8 < -1) {
    uVar10 = 0xffffffffffffffff;
  }
  piVar4 = (int *)operator_new__(uVar10);
  lVar12 = 0;
  memset(piVar4,0,uVar10);
  this->ptr = piVar4;
  uVar10 = (long)iVar3 * 4;
  if (iVar3 < 0) {
    uVar10 = 0xffffffffffffffff;
  }
  __n = (long)iVar3 * 8;
  if (iVar3 < 0) {
    __n = 0xffffffffffffffff;
  }
  piVar5 = (int *)operator_new__(uVar10);
  memset(piVar5,0,uVar10);
  this->idx = piVar5;
  pdVar6 = (double *)operator_new__(__n);
  memset(pdVar6,0,__n);
  this->val = pdVar6;
  uVar10 = lVar8 * 4;
  if (lVar8 < 0) {
    uVar10 = 0xffffffffffffffff;
  }
  piVar5 = (int *)operator_new__(uVar10);
  this->nzRow = piVar5;
  *piVar4 = 0;
  lVar8 = std::chrono::_V2::system_clock::now();
  piVar4 = this->ptr;
  piVar5 = this->nzRow;
  iVar3 = 0;
  for (; lVar12 < this->row; lVar12 = lVar12 + 1) {
    pdVar6 = this->val;
    piVar2 = this->idx;
    iVar9 = 0;
    for (lVar11 = 0; lVar11 < this->col; lVar11 = lVar11 + 1) {
      dVar1 = m->array[lVar12][lVar11];
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        pdVar6[iVar3] = dVar1;
        piVar2[iVar3] = (int)lVar11;
        iVar3 = iVar3 + 1;
        iVar9 = iVar9 + 1;
      }
    }
    piVar5[lVar12] = iVar9;
    piVar4[lVar12 + 1] = iVar9 + piVar4[lVar12];
  }
  lVar12 = std::chrono::_V2::system_clock::now();
  std::operator<<((ostream *)&std::cout,"execution time (initialize CSR):");
  poVar7 = std::ostream::_M_insert<double>((double)(lVar12 - lVar8) / 1000000000.0);
  std::operator<<(poVar7,"\n");
  if (this->nzRow != (int *)0x0) {
    operator_delete__(this->nzRow);
    return;
  }
  return;
}

Assistant:

void CSR::initializeWithMatirx1(Matrix *m)//Private
{
    int c = 0;
    int s;
    row = m->rowNo;
    col = m->colNo;
    nonzero = m->getNonzero();

    ptr = new int[row + 1]();
    idx = new int[nonzero]();
    val = new double[nonzero]();
    nzRow = new int[row];
    ptr[0] = 0;

    std::chrono::time_point<std::chrono::system_clock> start, end;
    std::chrono::duration<double> elapsed_seconds;
    start = std::chrono::system_clock::now();
    for (int i = 0; i < row; i++)
    {
        s = 0;
        for (int j = 0; j < col; j++)
        {
            if (m->array[i][j] != 0)
            {
                val[c] = m->array[i][j];
                idx[c] = j;
                c++;
                s++;
            }
        }
        nzRow[i] = s;
        ptr[i+1] = ptr[i]+nzRow[i];
    }

    end = std::chrono::system_clock::now();
    elapsed_seconds = end - start;
    double durationSym = elapsed_seconds.count();
    cout << "execution time (initialize CSR):" << durationSym << "\n";

    delete []nzRow;
}